

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::average<Ptex::v2_4::PtexHalf>
               (PtexHalf *src,int sstride,int uw,int vw,PtexHalf *dst,int nchan)

{
  long lVar1;
  float fVar2;
  undefined8 uStack_70;
  undefined1 auStack_68 [4];
  float fStack_64;
  undefined8 uStack_60;
  float local_58;
  int i_1;
  float scale;
  int i;
  PtexHalf *rowend;
  PtexHalf *end;
  int rowskip;
  int rowlen;
  float *buff;
  PtexHalf *pPStack_28;
  int nchan_local;
  PtexHalf *dst_local;
  int local_18;
  int vw_local;
  int uw_local;
  int sstride_local;
  PtexHalf *src_local;
  
  lVar1 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  _rowskip = auStack_68 + lVar1;
  buff._4_4_ = nchan;
  pPStack_28 = dst;
  dst_local._4_4_ = vw;
  local_18 = uw;
  vw_local = sstride;
  _uw_local = src;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0xbe036d;
  memset(auStack_68 + lVar1,0,(long)nchan << 2);
  vw_local = vw_local / 2;
  end._4_4_ = local_18 * buff._4_4_;
  end._0_4_ = vw_local - local_18 * buff._4_4_;
  rowend = _uw_local + dst_local._4_4_ * vw_local;
  for (; _uw_local != rowend; _uw_local = _uw_local + (int)end) {
    _scale = _uw_local + end._4_4_;
    while (_uw_local != _scale) {
      for (i_1 = 0; i_1 < buff._4_4_; i_1 = i_1 + 1) {
        _uw_local = _uw_local + 1;
        *(undefined8 *)((long)&uStack_70 + lVar1) = 0xbe03ef;
        fVar2 = PtexHalf::operator_cast_to_float(*(PtexHalf **)((long)&uStack_70 + lVar1));
        *(float *)(_rowskip + (long)i_1 * 4) = fVar2 + *(float *)(_rowskip + (long)i_1 * 4);
      }
    }
  }
  local_58 = 1.0 / (float)(local_18 * dst_local._4_4_);
  for (uStack_60._4_4_ = 0; uStack_60._4_4_ < buff._4_4_; uStack_60._4_4_ = uStack_60._4_4_ + 1) {
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0xbe046c;
    PtexHalf::PtexHalf(*(PtexHalf **)((long)&uStack_60 + lVar1),*(float *)((long)&fStack_64 + lVar1)
                      );
    pPStack_28[uStack_60._4_4_].bits = uStack_60._2_2_;
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }